

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O1

void __thiscall wasm::ParseException::dump(ParseException *this,ostream *o)

{
  ostream *poVar1;
  
  Colors::outputColorCode(o,"\x1b[35m");
  std::__ostream_insert<char,std::char_traits<char>>(o,"[",1);
  Colors::outputColorCode(o,"\x1b[31m");
  std::__ostream_insert<char,std::char_traits<char>>(o,"parse exception: ",0x11);
  Colors::outputColorCode(o,"\x1b[32m");
  std::__ostream_insert<char,std::char_traits<char>>
            (o,(this->text)._M_dataplus._M_p,(this->text)._M_string_length);
  if (this->line != 0xffffffffffffffff) {
    Colors::outputColorCode(o,"\x1b[0m");
    std::__ostream_insert<char,std::char_traits<char>>(o," (at ",5);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  }
  Colors::outputColorCode(o,"\x1b[35m");
  std::__ostream_insert<char,std::char_traits<char>>(o,"]",1);
  Colors::outputColorCode(o,"\x1b[0m");
  return;
}

Assistant:

void ParseException::dump(std::ostream& o) const {
  Colors::magenta(o);
  o << "[";
  Colors::red(o);
  o << "parse exception: ";
  Colors::green(o);
  o << text;
  if (line != size_t(-1)) {
    Colors::normal(o);
    o << " (at " << line << ":" << col << ")";
  }
  Colors::magenta(o);
  o << "]";
  Colors::normal(o);
}